

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglPartialUpdateTests.cpp
# Opt level: O1

void deqp::egl::anon_unknown_0::generateRandomFrame
               (Frame *dst,
               vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
               *drawTypes,Random *rnd)

{
  int iVar1;
  pointer *ppDVar2;
  int iVar3;
  int iVar4;
  DrawType DVar5;
  pointer pDVar6;
  pointer __n;
  deUint32 dVar7;
  deUint32 dVar8;
  deUint32 dVar9;
  deUint32 dVar10;
  deUint32 dVar11;
  deUint32 dVar12;
  deUint32 dVar13;
  ulong uVar14;
  pointer pDVar15;
  pointer pDVar16;
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  pointer pDVar21;
  long lVar22;
  _Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
  *this;
  ulong uVar23;
  int iVar24;
  
  if ((drawTypes->
      super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (drawTypes->
      super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    uVar18 = 0;
    do {
      iVar1 = dst->width + -1;
      iVar19 = dst->width + 6;
      if (-1 < iVar1) {
        iVar19 = iVar1;
      }
      dVar7 = deRandom_getUint32(&rnd->m_rnd);
      iVar1 = dst->height + -1;
      iVar24 = dst->height + 6;
      if (-1 < iVar1) {
        iVar24 = iVar1;
      }
      dVar8 = deRandom_getUint32(&rnd->m_rnd);
      iVar3 = dst->width;
      dVar9 = deRandom_getUint32(&rnd->m_rnd);
      iVar4 = dst->height;
      dVar10 = deRandom_getUint32(&rnd->m_rnd);
      dVar11 = deRandom_getUint32(&rnd->m_rnd);
      dVar12 = deRandom_getUint32(&rnd->m_rnd);
      dVar13 = deRandom_getUint32(&rnd->m_rnd);
      uVar23 = (ulong)dVar8 % (ulong)((iVar24 >> 3) + 1) << 0x22 |
               (ulong)(dVar7 % ((iVar19 >> 3) + 1U) << 2);
      iVar1 = iVar4 + -1;
      iVar19 = iVar4 + 6;
      iVar24 = iVar4 + 2;
      if (-1 < iVar1) {
        iVar19 = iVar1;
        iVar24 = iVar1;
      }
      iVar1 = iVar3 + -1;
      iVar4 = iVar3 + 6;
      iVar3 = iVar3 + 2;
      if (-1 < iVar1) {
        iVar4 = iVar1;
        iVar3 = iVar1;
      }
      uVar20 = (ulong)(dVar10 % (((iVar24 >> 2) - (iVar19 >> 3)) + 1U) + (iVar19 >> 3)) << 0x22 |
               (ulong)((dVar9 % (((iVar3 >> 2) - (iVar4 >> 3)) + 1U) + (iVar4 >> 3)) * 4);
      DVar5 = (drawTypes->
              super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
              )._M_impl.super__Vector_impl_data._M_start[uVar18];
      pDVar6 = (dst->draws).
               super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pDVar6 == (dst->draws).
                    super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        __n = (dst->draws).
              super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
              ._M_impl.super__Vector_impl_data._M_start;
        lVar22 = (long)pDVar6 - (long)__n;
        if (lVar22 == 0x7ffffffffffffff8) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar14 = (lVar22 >> 3) * -0x5555555555555555;
        uVar17 = uVar14;
        if (pDVar6 == __n) {
          uVar17 = 1;
        }
        this = (_Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                *)(uVar17 + uVar14);
        if ((_Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
             *)0x555555555555554 < this) {
          this = (_Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                  *)0x555555555555555;
        }
        if (CARRY8(uVar17,uVar14)) {
          this = (_Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                  *)0x555555555555555;
        }
        pDVar15 = std::
                  _Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                  ::_M_allocate(this,(size_t)__n);
        *(DrawType *)((long)pDVar15 + lVar22) = DVar5;
        *(ulong *)((long)pDVar15 + lVar22 + 4) = uVar23;
        *(ulong *)((long)pDVar15 + lVar22 + 0xc) = uVar20;
        *(uchar *)((long)pDVar15 + lVar22 + 0x14) = (uchar)dVar11;
        *(uchar *)((long)pDVar15 + lVar22 + 0x15) = (uchar)dVar12;
        *(uchar *)((long)pDVar15 + lVar22 + 0x16) = (uchar)dVar13;
        pDVar21 = pDVar15;
        for (pDVar16 = __n; pDVar6 != pDVar16; pDVar16 = pDVar16 + 1) {
          pDVar21->drawType = pDVar16->drawType;
          lVar22 = 1;
          do {
            (pDVar21->rect).bottomLeft.m_data[lVar22 + -1] =
                 (pDVar16->rect).bottomLeft.m_data[lVar22 + -1];
            lVar22 = lVar22 + 1;
          } while (lVar22 == 2);
          lVar22 = 3;
          do {
            (pDVar21->rect).bottomLeft.m_data[lVar22 + -1] =
                 (pDVar16->rect).bottomLeft.m_data[lVar22 + -1];
            lVar22 = lVar22 + 1;
          } while (lVar22 == 4);
          lVar22 = 0x14;
          do {
            *(undefined1 *)((long)(pDVar21->rect).bottomLeft.m_data + lVar22 + -4) =
                 *(undefined1 *)((long)(pDVar16->rect).bottomLeft.m_data + lVar22 + -4);
            lVar22 = lVar22 + 1;
          } while (lVar22 != 0x17);
          pDVar21 = pDVar21 + 1;
        }
        if (__n != (pointer)0x0) {
          operator_delete(__n,(long)(dst->draws).
                                    super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)__n);
        }
        (dst->draws).
        super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
        ._M_impl.super__Vector_impl_data._M_start = pDVar15;
        (dst->draws).
        super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
        ._M_impl.super__Vector_impl_data._M_finish = pDVar21 + 1;
        (dst->draws).
        super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = pDVar15 + (long)this;
      }
      else {
        pDVar6->drawType = DVar5;
        *(ulong *)(pDVar6->rect).bottomLeft.m_data = uVar23;
        *(ulong *)(pDVar6->rect).topRight.m_data = uVar20;
        (pDVar6->rect).color.m_data[0] = (uchar)dVar11;
        (pDVar6->rect).color.m_data[1] = (uchar)dVar12;
        (pDVar6->rect).color.m_data[2] = (uchar)dVar13;
        ppDVar2 = &(dst->draws).
                   super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppDVar2 = *ppDVar2 + 1;
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 < (ulong)((long)(drawTypes->
                                    super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(drawTypes->
                                    super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 2));
  }
  return;
}

Assistant:

void generateRandomFrame (Frame& dst, const vector<PartialUpdateTest::DrawType>& drawTypes, de::Random& rnd)
{
	for (size_t ndx = 0; ndx < drawTypes.size(); ndx++)
	{
		const int			x1			= rnd.getInt(0, (dst.width-1)/8) * 4;
		const int			y1			= rnd.getInt(0, (dst.height-1)/8) * 4;
		const int			x2			= rnd.getInt((dst.width-1)/8, (dst.width-1)/4) * 4;
		const int			y2			= rnd.getInt((dst.height-1)/8, (dst.height-1)/4) * 4;
		const GLubyte		r			= rnd.getUint8();
		const GLubyte		g			= rnd.getUint8();
		const GLubyte		b			= rnd.getUint8();
		const ColoredRect	coloredRect	(IVec2(x1, y1), IVec2(x2, y2), Color(r, g, b));
		const DrawCommand	drawCommand	(drawTypes[ndx], coloredRect);

		dst.draws.push_back(drawCommand);
	}
}